

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O1

ssize_t nghttp2_hd_huff_decode
                  (nghttp2_hd_huff_decode_context *ctx,nghttp2_buf *buf,uint8_t *src,size_t srclen,
                  int final)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint8_t *puVar4;
  byte bVar5;
  size_t sVar6;
  uint uVar7;
  ushort *puVar8;
  uint16_t local_1a;
  
  local_1a = ctx->fstate;
  puVar8 = &local_1a;
  if (srclen != 0) {
    sVar6 = 0;
    do {
      bVar1 = src[sVar6];
      bVar5 = bVar1 >> 4;
      uVar7 = (*puVar8 & 0x1ff) << 6;
      uVar3 = *(ushort *)((long)&huff_decode_table[0][bVar5].fstate + (ulong)uVar7);
      if ((short)uVar3 < 0) {
        uVar2 = (&huff_decode_table[0][bVar5].sym)[uVar7];
        puVar4 = buf->last;
        buf->last = puVar4 + 1;
        *puVar4 = uVar2;
      }
      puVar8 = (ushort *)
               ((long)&huff_decode_table[0][bVar1 & 0xf].fstate + (ulong)((uVar3 & 0x1ff) << 6));
      if ((short)*puVar8 < 0) {
        uVar3 = puVar8[1];
        puVar4 = buf->last;
        buf->last = puVar4 + 1;
        *puVar4 = (uint8_t)uVar3;
      }
      sVar6 = sVar6 + 1;
    } while (srclen != sVar6);
  }
  uVar3 = *puVar8;
  ctx->fstate = uVar3;
  sVar6 = 0xfffffffffffffdf5;
  if ((uVar3 >> 0xe & 1) != 0) {
    sVar6 = srclen;
  }
  if (final == 0) {
    sVar6 = srclen;
  }
  return sVar6;
}

Assistant:

ssize_t nghttp2_hd_huff_decode(nghttp2_hd_huff_decode_context *ctx,
                               nghttp2_buf *buf, const uint8_t *src,
                               size_t srclen, int final) {
  const uint8_t *end = src + srclen;
  nghttp2_huff_decode node = {ctx->fstate, 0};
  const nghttp2_huff_decode *t = &node;
  uint8_t c;

  /* We use the decoding algorithm described in
     http://graphics.ics.uci.edu/pub/Prefix.pdf */
  for (; src != end;) {
    c = *src++;
    t = &huff_decode_table[t->fstate & 0x1ff][c >> 4];
    if (t->fstate & NGHTTP2_HUFF_SYM) {
      *buf->last++ = t->sym;
    }

    t = &huff_decode_table[t->fstate & 0x1ff][c & 0xf];
    if (t->fstate & NGHTTP2_HUFF_SYM) {
      *buf->last++ = t->sym;
    }
  }

  ctx->fstate = t->fstate;

  if (final && !(ctx->fstate & NGHTTP2_HUFF_ACCEPTED)) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  return (ssize_t)srclen;
}